

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprSetHeight(Expr *p)

{
  int iVar1;
  Select *p_00;
  long *plVar2;
  long lVar3;
  int local_14;
  
  local_14 = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_14 = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_14 < iVar1)) {
    local_14 = iVar1;
  }
  p_00 = (Select *)(p->x).pList;
  if ((p->flags & 0x800) == 0) {
    if ((p_00 != (Select *)0x0) && (0 < *(int *)&p_00->pEList)) {
      plVar2 = *(long **)&p_00->op;
      lVar3 = 0;
      do {
        if ((*plVar2 != 0) && (iVar1 = *(int *)(*plVar2 + 0x28), local_14 < iVar1)) {
          local_14 = iVar1;
        }
        lVar3 = lVar3 + 1;
        plVar2 = plVar2 + 4;
      } while (lVar3 < *(int *)&p_00->pEList);
    }
  }
  else {
    heightOfSelect(p_00,&local_14);
  }
  p->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else{
    heightOfExprList(p->x.pList, &nHeight);
  }
  p->nHeight = nHeight + 1;
}